

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

int WebPIoInitFromOptions(WebPDecoderOptions *options,VP8Io *io,WEBP_CSP_MODE src_colorspace)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  WEBP_CSP_MODE in_EDX;
  int *in_RSI;
  int *in_RDI;
  bool bVar6;
  int scaled_height;
  int scaled_width;
  int h;
  int w;
  int y;
  int x;
  int H;
  int W;
  bool local_41;
  uint3 in_stack_ffffffffffffffc0;
  uint h_00;
  int in_stack_ffffffffffffffc4;
  int iVar7;
  int in_stack_ffffffffffffffc8;
  int x_00;
  uint image_width;
  uint local_28;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  local_28 = 0;
  image_width = 0;
  h_00 = (uint)in_stack_ffffffffffffffc0;
  if (in_RDI != (int *)0x0) {
    h_00 = CONCAT13(in_RDI[2] != 0,in_stack_ffffffffffffffc0);
  }
  in_RSI[0x1d] = h_00 >> 0x18;
  x_00 = iVar2;
  iVar5 = iVar1;
  if (in_RSI[0x1d] != 0) {
    iVar5 = in_RDI[5];
    x_00 = in_RDI[6];
    local_28 = in_RDI[3];
    image_width = in_RDI[4];
    iVar4 = WebPIsRGBMode(in_EDX);
    if (iVar4 == 0) {
      local_28 = local_28 & 0xfffffffe;
      image_width = image_width & 0xfffffffe;
    }
    iVar4 = WebPCheckCropDimensions
                      (image_width,iVar5,x_00,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                       h_00);
    if (iVar4 == 0) {
      return 0;
    }
  }
  in_RSI[0x1e] = local_28;
  in_RSI[0x20] = image_width;
  in_RSI[0x1f] = local_28 + iVar5;
  in_RSI[0x21] = image_width + x_00;
  in_RSI[3] = iVar5;
  in_RSI[4] = x_00;
  bVar6 = false;
  if (in_RDI != (int *)0x0) {
    bVar6 = in_RDI[7] != 0;
  }
  in_RSI[0x22] = (uint)bVar6;
  if (in_RSI[0x22] != 0) {
    iVar4 = in_RDI[8];
    iVar7 = in_RDI[9];
    iVar5 = WebPRescalerGetScaledDimensions
                      (iVar5,x_00,(int *)&stack0xffffffffffffffc8,(int *)&stack0xffffffffffffffc4);
    if (iVar5 == 0) {
      return 0;
    }
    in_RSI[0x23] = iVar4;
    in_RSI[0x24] = iVar7;
  }
  bVar6 = false;
  if (in_RDI != (int *)0x0) {
    bVar6 = *in_RDI != 0;
  }
  in_RSI[0x1c] = (uint)bVar6;
  bVar3 = 1;
  if (in_RDI != (int *)0x0) {
    bVar3 = in_RDI[1] != 0 ^ 0xff;
  }
  in_RSI[0x16] = (uint)(bVar3 & 1);
  if (in_RSI[0x22] != 0) {
    local_41 = false;
    if (in_RSI[0x23] < (iVar1 * 3) / 4) {
      local_41 = in_RSI[0x24] < (iVar2 * 3) / 4;
    }
    in_RSI[0x1c] = (uint)local_41 | in_RSI[0x1c];
    in_RSI[0x16] = 0;
  }
  return 1;
}

Assistant:

int WebPIoInitFromOptions(const WebPDecoderOptions* const options,
                          VP8Io* const io, WEBP_CSP_MODE src_colorspace) {
  const int W = io->width;
  const int H = io->height;
  int x = 0, y = 0, w = W, h = H;

  // Cropping
  io->use_cropping = (options != NULL) && options->use_cropping;
  if (io->use_cropping) {
    w = options->crop_width;
    h = options->crop_height;
    x = options->crop_left;
    y = options->crop_top;
    if (!WebPIsRGBMode(src_colorspace)) {   // only snap for YUV420
      x &= ~1;
      y &= ~1;
    }
    if (!WebPCheckCropDimensions(W, H, x, y, w, h)) {
      return 0;  // out of frame boundary error
    }
  }
  io->crop_left   = x;
  io->crop_top    = y;
  io->crop_right  = x + w;
  io->crop_bottom = y + h;
  io->mb_w = w;
  io->mb_h = h;

  // Scaling
  io->use_scaling = (options != NULL) && options->use_scaling;
  if (io->use_scaling) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (!WebPRescalerGetScaledDimensions(w, h, &scaled_width, &scaled_height)) {
      return 0;
    }
    io->scaled_width = scaled_width;
    io->scaled_height = scaled_height;
  }

  // Filter
  io->bypass_filtering = (options != NULL) && options->bypass_filtering;

  // Fancy upsampler
#ifdef FANCY_UPSAMPLING
  io->fancy_upsampling = (options == NULL) || (!options->no_fancy_upsampling);
#endif

  if (io->use_scaling) {
    // disable filter (only for large downscaling ratio).
    io->bypass_filtering |= (io->scaled_width < W * 3 / 4) &&
                            (io->scaled_height < H * 3 / 4);
    io->fancy_upsampling = 0;
  }
  return 1;
}